

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O3

void fio_lib_destroy(void)

{
  block_s *blk;
  uint uVar1;
  arena_s *paVar2;
  anon_struct_32_4_90625080 *paVar3;
  size_t sVar4;
  size_t i;
  long lVar5;
  ulong uVar6;
  bool bVar7;
  
  if (fio_data->is_worker == '\0') {
    bVar7 = false;
  }
  else {
    bVar7 = fio_data->workers != 1;
  }
  fio_data->active = '\0';
  fio_on_fork();
  fio_defer_perform();
  fio_timer_clear_all();
  fio_defer_perform();
  fio_state_callback_force(FIO_CALL_AT_EXIT);
  lVar5 = 0;
  do {
    fio_state_callback_clear((callback_type_e)lVar5);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0xe);
  fio_defer_perform();
  lVar5 = 0;
  do {
    if (*(int *)((long)evio_fd + lVar5) != -1) {
      close(*(int *)((long)evio_fd + lVar5));
      *(undefined4 *)((long)evio_fd + lVar5) = 0xffffffff;
    }
    lVar5 = lVar5 + 4;
  } while (lVar5 != 0xc);
  fio_free(fio_data);
  if (arenas == (arena_s *)0x0) goto LAB_0012ea0a;
  if (memory.cores != 0) {
    lVar5 = 0;
    uVar6 = 0;
    paVar2 = arenas;
    sVar4 = memory.cores;
    do {
      blk = *(block_s **)((long)&paVar2->block + lVar5);
      if (blk != (block_s *)0x0) {
        block_free(blk);
        paVar2 = arenas;
        sVar4 = memory.cores;
      }
      *(undefined8 *)((long)&paVar2->block + lVar5) = 0;
      uVar6 = uVar6 + 1;
      lVar5 = lVar5 + 0x10;
    } while (uVar6 < sVar4);
  }
  if ((anon_struct_32_4_90625080 *)memory.available.next != &memory && memory.forked == '\0') {
    if (FIO_LOG_LEVEL < 3) {
LAB_0012e9be:
      lVar5 = 0;
      paVar3 = (anon_struct_32_4_90625080 *)memory.available.next;
      do {
        lVar5 = lVar5 + 1;
        paVar3 = (anon_struct_32_4_90625080 *)(paVar3->available).next;
      } while (paVar3 != &memory);
    }
    else {
      lVar5 = 0;
      FIO_LOG2STDERR(
                    "WARNING: facil.io detected memory traces remaining after cleanup - memory leak?"
                    );
      if ((anon_struct_32_4_90625080 *)memory.available.next != &memory) goto LAB_0012e9be;
    }
    if (4 < FIO_LOG_LEVEL) {
      FIO_LOG2STDERR("DEBUG (/workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fio.c:7328): Memory blocks in pool: %zu (%zu blocks per allocation)."
                     ,lVar5,0x100);
    }
  }
  munmap(arenas + -1,(size_t)arenas[-1].block);
  arenas = (arena_s *)0x0;
LAB_0012ea0a:
  if (4 < FIO_LOG_LEVEL) {
    uVar1 = getpid();
    FIO_LOG2STDERR("DEBUG (/workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fio.c:3548): (%d) facil.io resources released, exit complete."
                   ,(ulong)uVar1);
  }
  if (bVar7) {
    return;
  }
  fputc(10,_stderr);
  return;
}

Assistant:

static void __attribute__((destructor)) fio_lib_destroy(void) {
  uint8_t add_eol = fio_is_master();
  fio_data->active = 0;
  fio_on_fork();
  fio_defer_perform();
  fio_timer_clear_all();
  fio_defer_perform();
  fio_state_callback_force(FIO_CALL_AT_EXIT);
  fio_state_callback_clear_all();
  fio_defer_perform();
  fio_poll_close();
  fio_free(fio_data);
  /* memory library destruction must be last */
  fio_mem_destroy();
  FIO_LOG_DEBUG("(%d) facil.io resources released, exit complete.",
                (int)getpid());
  if (add_eol)
    fprintf(stderr, "\n"); /* add EOL to logs (logging adds EOL before text */
}